

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::SpreadArrayArgs
              (Var arrayToSpread,AuxArray<unsigned_int> *spreadIndices,ScriptContext *scriptContext)

{
  uint end;
  uint end_00;
  List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint32 rhs;
  uint elementCount;
  BOOL BVar5;
  uint start;
  JavascriptArray *srcArray;
  undefined4 extraout_var;
  Var pvVar6;
  JavascriptArray *dstArray;
  undefined4 extraout_var_00;
  SpreadArgument *pSVar7;
  uint i;
  uint dstIndex;
  ulong uVar8;
  ulong uVar9;
  WriteBarrierPtr<void> *pWVar10;
  undefined1 local_a8 [8];
  anon_class_16_2_4d2d011e slowCopy;
  ScriptContext *local_88;
  ScriptContext *scriptContext_local;
  anon_class_8_1_9014563a local_78;
  anon_class_8_1_9014563a needArraySlowCopy;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  local_88 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,arrayToSpread);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arrayToSpread);
  srcArray = VarTo<Js::JavascriptArray>(arrayToSpread);
  end = (srcArray->super_ArrayObject).length;
  elementCount = end;
  for (uVar8 = 0; uVar8 < spreadIndices->count; uVar8 = uVar8 + 1) {
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    iVar4 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(srcArray,(ulong)spreadIndices[uVar8 + 1].count);
    rhs = GetSpreadArgLen((Var)CONCAT44(extraout_var,iVar4),local_88);
    elementCount = UInt32Math::Add(elementCount - 1,rhs);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
  }
  pvVar6 = OP_NewScArrayWithMissingValues(elementCount,local_88);
  dstArray = VarTo<Js::JavascriptArray>(pvVar6);
  needArraySlowCopy.jsReentLock = (JsReentLock *)0x0;
  jsReentLock._24_8_ = __tls_get_addr(&PTR_013e5f18);
  dstIndex = 0;
  start = 0;
  slowCopy.needArraySlowCopy = (anon_class_8_1_9014563a *)srcArray;
  scriptContext_local = (ScriptContext *)spreadIndices;
  while( true ) {
    while( true ) {
      if ((end <= start) || (elementCount <= dstIndex)) goto LAB_00a53965;
      end_00 = *(uint *)((long)&(scriptContext_local->super_ScriptContextInfo).
                                _vptr_ScriptContextInfo +
                        ((ulong)needArraySlowCopy.jsReentLock & 0xffffffff) * 4 + 4);
      local_78.jsReentLock = (JsReentLock *)local_68;
      local_a8 = (undefined1  [8])&local_88;
      slowCopy.scriptContext = (ScriptContext **)&local_78;
      if (end_00 <= start) break;
      bVar3 = SpreadArrayArgs::anon_class_8_1_9014563a::operator()(&local_78,srcArray);
      if (bVar3) {
        SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                  ((anon_class_16_2_4d2d011e *)local_a8,dstArray,dstIndex,srcArray,start,end_00);
      }
      else {
        *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        CopyAnyArrayElementsToVar<unsigned_int>(dstArray,dstIndex,srcArray,start,end_00);
        JsReentLock::MutateArrayObject((JsReentLock *)local_68);
        *(bool *)((long)local_68 + 0x108) = true;
      }
      dstIndex = (dstIndex - start) + end_00;
      start = end_00;
    }
    if (end_00 < start) break;
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    iVar4 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(srcArray,(ulong)start);
    pvVar6 = (Var)CONCAT44(extraout_var_00,iVar4);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
    bVar3 = VarIs<Js::SpreadArgument>(pvVar6);
    if (bVar3) {
      pSVar7 = VarTo<Js::SpreadArgument>(pvVar6);
      pLVar1 = (pSVar7->iteratorIndices).ptr;
      if (pLVar1 == (List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
                    0x0) {
        uVar8 = 0;
        pWVar10 = (WriteBarrierPtr<void> *)0x0;
      }
      else {
        uVar8 = (ulong)(uint)(pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>)
                             .count;
        pWVar10 = (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr
        ;
      }
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        DirectSetItemAt<void*>(dstArray,dstIndex + (int)uVar9,pWVar10[uVar9].ptr);
      }
      dstIndex = dstIndex + (int)uVar9;
      srcArray = (JavascriptArray *)slowCopy.needArraySlowCopy;
    }
    else {
      BVar5 = JavascriptOperators::IsUndefinedObject(pvVar6);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)jsReentLock._24_8_ = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e0a,"(JavascriptOperators::IsUndefinedObject(instance))",
                                    "JavascriptOperators::IsUndefinedObject(instance)");
        if (!bVar3) goto LAB_00a539cd;
        *(undefined4 *)jsReentLock._24_8_ = 0;
      }
      DirectSetItemAt<void*>(dstArray,dstIndex,pvVar6);
      dstIndex = dstIndex + 1;
    }
    needArraySlowCopy.jsReentLock =
         (JsReentLock *)
         (ulong)((uint)needArraySlowCopy.jsReentLock +
                (uint)((uint)needArraySlowCopy.jsReentLock <
                      *(int *)&(scriptContext_local->super_ScriptContextInfo).
                               _vptr_ScriptContextInfo - 1U));
    start = start + 1;
  }
  if ((int)needArraySlowCopy.jsReentLock !=
      *(int *)&(scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo + -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)jsReentLock._24_8_ = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2dee,"(spreadArrIndex == spreadIndices->count - 1)",
                                "spreadArrIndex == spreadIndices->count - 1");
    if (!bVar3) goto LAB_00a539cd;
    *(undefined4 *)jsReentLock._24_8_ = 0;
  }
  bVar3 = SpreadArrayArgs::anon_class_8_1_9014563a::operator()(&local_78,srcArray);
  if (bVar3) {
    SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
              ((anon_class_16_2_4d2d011e *)local_a8,dstArray,dstIndex,srcArray,start,end);
  }
  else {
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    CopyAnyArrayElementsToVar<unsigned_int>(dstArray,dstIndex,srcArray,start,end);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
  }
LAB_00a53965:
  if (end != (srcArray->super_ArrayObject).length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *(undefined4 *)jsReentLock._24_8_ = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e14,"(arrayLength == array->GetLength())",
                                "Array\'s length should not have changed");
    if (!bVar3) {
LAB_00a539cd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)jsReentLock._24_8_ = 0;
  }
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return dstArray;
}

Assistant:

Var JavascriptArray::SpreadArrayArgs(Var arrayToSpread, const Js::AuxArray<uint32> *spreadIndices, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arrayToSpread);

        // At this stage we have an array literal with some arguments to be spread.
        // First we need to calculate the real size of the final literal.
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayToSpread);
#endif
        JavascriptArray *array = VarTo<JavascriptArray>(arrayToSpread);
        uint32 arrayLength = array->GetLength();
        uint32 actualLength = arrayLength;

        for (unsigned i = 0; i < spreadIndices->count; ++i)
        {
            JS_REENTRANT(jsReentLock,
                actualLength = UInt32Math::Add(actualLength - 1, GetSpreadArgLen(array->DirectGetItem(spreadIndices->elements[i]), scriptContext)));
        }

        JavascriptArray *result = VarTo<JavascriptArray>(OP_NewScArrayWithMissingValues(actualLength, scriptContext));

        // Now we copy each element and expand the spread parameters inline.
        for (unsigned i = 0, spreadArrIndex = 0, resultIndex = 0; i < arrayLength && resultIndex < actualLength; ++i)
        {
            uint32 spreadIndex = spreadIndices->elements[spreadArrIndex]; // The index of the next element to be spread.

            // An array needs a slow copy if it is a cross-site object or we have missing values that need to be set to undefined.
            auto needArraySlowCopy = [&](Var instance) {
                JavascriptArray *arr = JavascriptArray::TryVarToNonES5Array(instance);
                if (arr)
                {
                    JS_REENTRANT_UNLOCK(jsReentLock, return arr->IsCrossSiteObject() || arr->IsFillFromPrototypes());
                }
                return false;
            };

            // Designed to have interchangeable arguments with CopyAnyArrayElementsToVar.
            auto slowCopy = [&scriptContext, &needArraySlowCopy
                ](JavascriptArray *dstArray, unsigned dstIndex, Var srcArray, uint32 start, uint32 end) {
                Assert(needArraySlowCopy(srcArray) || VarIs<ArgumentsObject>(srcArray) || VarIs<TypedArrayBase>(srcArray) || VarIs<JavascriptString>(srcArray));
                JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

                RecyclableObject *propertyObject;
                if (!JavascriptOperators::GetPropertyObject(srcArray, scriptContext, &propertyObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidSpreadArgument);
                }

                for (uint32 j = start; j < end; j++)
                {
                    Var element;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(srcArray, propertyObject, j, &element, scriptContext));
                    if (!gotItem)
                    {
                        // skip elided elements
                        dstIndex++;
                    }
                    else
                    {
                        dstArray->DirectSetItemAt(dstIndex++, element);
                    }
                }
            };

            if (i < spreadIndex)
            {
                // Any non-spread elements can be copied in bulk.

                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, (Var)array, i, spreadIndex);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, spreadIndex));
                }
                resultIndex += spreadIndex - i;
                i = spreadIndex - 1;
                continue;
            }
            else if (i > spreadIndex)
            {
                // Any non-spread elements terminating the array can also be copied in bulk.
                Assert(spreadArrIndex == spreadIndices->count - 1);
                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, array, i, arrayLength);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, arrayLength));
                }
                break;
            }
            else
            {
                JS_REENTRANT(jsReentLock, Var instance = array->DirectGetItem(i));

                if (VarIs<SpreadArgument>(instance))
                {
                    SpreadArgument* spreadArgument = VarTo<SpreadArgument>(instance);
                    uint32 len = spreadArgument->GetArgumentSpreadCount();
                    const Var*  spreadItems = spreadArgument->GetArgumentSpread();
                    for (uint32 j = 0; j < len; j++)
                    {
                        result->DirectSetItemAt(resultIndex++, spreadItems[j]);
                    }

                }
                else
                {
                    Assert(JavascriptOperators::IsUndefinedObject(instance));
                    result->DirectSetItemAt(resultIndex++, instance);
                }

                if (spreadArrIndex < spreadIndices->count - 1)
                {
                    spreadArrIndex++;
                }
            }
        }
        AssertMsg(arrayLength == array->GetLength(), "Array's length should not have changed");
        return result;
    }